

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindInIndex(Parse *pParse,Expr *pX,u32 inFlags,int *prRhsHasNull)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  u32 uVar4;
  SrcList *pSVar5;
  Expr *pEVar6;
  Table *pTVar7;
  sqlite3 *db;
  char cVar8;
  uint uVar9;
  Vdbe *p;
  Select *pSVar10;
  ulong uVar11;
  ulong uVar12;
  CollSeq *pCVar13;
  CollSeq *pCVar14;
  Vdbe *pVVar15;
  KeyInfo *zP4;
  uint uVar16;
  int iVar17;
  int iVar18;
  Schema **ppSVar19;
  Index *pIdx;
  int iVar20;
  bool bVar21;
  Walker local_68;
  
  iVar17 = pParse->nTab;
  pParse->nTab = iVar17 + 1;
  p = sqlite3GetVdbe(pParse);
  iVar18 = 0;
  if ((pX->flags & 0x800) == 0) {
    pSVar10 = (Select *)0x0;
  }
  else {
    pSVar10 = (pX->x).pSelect;
  }
  iVar20 = 0;
  if ((((((pSVar10 != (Select *)0x0 && pParse->nErr == 0) &&
         (iVar20 = iVar18, pSVar10->pPrior == (Select *)0x0)) && ((pSVar10->selFlags & 5) == 0)) &&
       (((pSVar10->pLimit == (Expr *)0x0 && (pSVar10->pWhere == (Expr *)0x0)) &&
        ((pSVar5 = pSVar10->pSrc, pSVar5->nSrc == 1 &&
         ((pSVar5->a[0].pSelect == (Select *)0x0 &&
          (pTVar7 = pSVar5->a[0].pTab, pTVar7 != (Table *)0x0)))))))) &&
      ((pTVar7->tabFlags & 0x10) == 0)) &&
     ((pSVar10->pEList->nExpr == 1 && (pSVar10->pEList->a->pExpr->op == 0x9a)))) {
    db = pParse->db;
    pTVar7 = pSVar10->pSrc->a[0].pTab;
    pEVar6 = pSVar10->pEList->a->pExpr;
    uVar3 = pEVar6->iColumn;
    if (pTVar7->pSchema == (Schema *)0x0) {
      uVar12 = 0xfff0bdc0;
    }
    else {
      uVar16 = db->nDb;
      if ((int)uVar16 < 1) {
        uVar12 = 0;
      }
      else {
        ppSVar19 = &db->aDb->pSchema;
        uVar11 = 0;
        do {
          uVar12 = uVar11;
          if (*ppSVar19 == pTVar7->pSchema) break;
          uVar11 = uVar11 + 1;
          ppSVar19 = ppSVar19 + 4;
          uVar12 = (ulong)uVar16;
        } while (uVar16 != uVar11);
      }
    }
    iVar18 = (int)(short)uVar12;
    sqlite3CodeVerifySchema(pParse,iVar18);
    sqlite3TableLock(pParse,iVar18,pTVar7->tnum,'\0',pTVar7->zName);
    if ((short)uVar3 < 0) {
      pVVar15 = sqlite3GetVdbe(pParse);
      iVar20 = pParse->nOnce;
      pParse->nOnce = iVar20 + 1;
      uVar9 = sqlite3VdbeAddOp3(pVVar15,0x2c,iVar20,0,0);
      sqlite3OpenTable(pParse,iVar17,iVar18,pTVar7,0x36);
      uVar16 = p->nOp;
      if (uVar9 < uVar16) {
        p->aOp[uVar9].p2 = uVar16;
      }
      p->pParse->iFixedOp = uVar16 - 1;
      iVar20 = 1;
    }
    else {
      pCVar13 = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pEVar6);
      cVar1 = (&pTVar7->aCol->affinity)[(uint)uVar3 * 0x30];
      cVar8 = comparisonAffinity(pX);
      if (cVar8 == 'A') {
        bVar21 = true;
      }
      else if (cVar8 == 'B') {
        bVar21 = cVar1 == 'B';
      }
      else {
        bVar21 = 'B' < cVar1;
      }
      pIdx = pTVar7->pIndex;
      iVar20 = 0;
      if ((pIdx != (Index *)0x0) && (bVar21)) {
        do {
          iVar20 = 0;
          if (*pIdx->aiColumn == uVar3) {
            pCVar14 = sqlite3FindCollSeq(db,db->enc,*pIdx->azColl,0);
            if ((pCVar14 == pCVar13) &&
               (((inFlags & 4) == 0 || ((iVar20 = 0, pIdx->nKeyCol == 1 && (pIdx->onError != '\0')))
                ))) {
              pVVar15 = sqlite3GetVdbe(pParse);
              iVar20 = pParse->nOnce;
              pParse->nOnce = iVar20 + 1;
              uVar16 = sqlite3VdbeAddOp3(pVVar15,0x2c,iVar20,0,0);
              sqlite3VdbeAddOp3(p,0x36,iVar17,pIdx->tnum,iVar18);
              pVVar15 = pParse->pVdbe;
              zP4 = sqlite3KeyInfoOfIndex(pParse,pIdx);
              sqlite3VdbeChangeP4(pVVar15,-1,(char *)zP4,-6);
              bVar2 = *pIdx->aSortOrder;
              if ((prRhsHasNull != (int *)0x0) &&
                 ((&pTVar7->aCol->notNull)[(uint)uVar3 * 0x30] == '\0')) {
                iVar20 = pParse->nMem + 1;
                pParse->nMem = iVar20;
                *prRhsHasNull = iVar20;
                sqlite3SetHasNullFlag(p,iVar17,iVar20);
              }
              uVar9 = p->nOp;
              if (uVar16 < uVar9) {
                p->aOp[uVar16].p2 = uVar9;
              }
              iVar20 = bVar2 + 3;
              p->pParse->iFixedOp = uVar9 - 1;
            }
          }
          pIdx = pIdx->pNext;
        } while ((bool)(bVar21 & (iVar20 == 0 && pIdx != (Index *)0x0)));
      }
    }
  }
  if (((iVar20 == 0) && (iVar20 = 0, (inFlags & 1) != 0)) && ((pX->flags & 0x800) == 0)) {
    pEVar6 = pX->pLeft;
    pX->pLeft = (Expr *)0x0;
    local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_68.pParse = (Parse *)0x0;
    local_68.walkerDepth = 0;
    local_68.eCode = '\x01';
    local_68._37_3_ = 0;
    local_68.xExprCallback = exprNodeIsConstant;
    local_68.xSelectCallback = selectNodeIsConstant;
    local_68.u.pNC = (NameContext *)0x0;
    sqlite3WalkExpr(&local_68,pX);
    pX->pLeft = pEVar6;
    if ((local_68.eCode == '\0') || (((pX->x).pList)->nExpr < 3)) {
      iVar20 = 5;
    }
  }
  if (iVar20 == 0) {
    uVar4 = pParse->nQueryLoop;
    if ((inFlags & 4) == 0) {
      iVar20 = 2;
      uVar16 = 0;
      if (prRhsHasNull == (int *)0x0) {
        iVar17 = 0;
      }
      else {
        iVar17 = pParse->nMem + 1;
        pParse->nMem = iVar17;
        *prRhsHasNull = iVar17;
        uVar16 = 0;
      }
    }
    else {
      pParse->nQueryLoop = 0;
      iVar20 = 2;
      iVar17 = 0;
      if (pX->pLeft->iColumn < 0) {
        uVar9 = pX->flags & 0x800;
        uVar16 = uVar9 >> 0xb ^ 1;
        iVar20 = 2 - (uint)(uVar9 == 0);
      }
      else {
        uVar16 = 0;
      }
    }
    sqlite3CodeSubselect(pParse,pX,iVar17,uVar16);
    pParse->nQueryLoop = uVar4;
  }
  else {
    pX->iTable = iVar17;
  }
  return iVar20;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindInIndex(Parse *pParse, Expr *pX, u32 inFlags, int *prRhsHasNull){
  Select *p;                            /* SELECT to the right of IN operator */
  int eType = 0;                        /* Type of RHS table. IN_INDEX_* */
  int iTab = pParse->nTab++;            /* Cursor of the RHS table */
  int mustBeUnique;                     /* True if RHS must be unique */
  Vdbe *v = sqlite3GetVdbe(pParse);     /* Virtual machine being coded */

  assert( pX->op==TK_IN );
  mustBeUnique = (inFlags & IN_INDEX_LOOP)!=0;

  /* Check to see if an existing table or index can be used to
  ** satisfy the query.  This is preferable to generating a new 
  ** ephemeral table.
  */
  p = (ExprHasProperty(pX, EP_xIsSelect) ? pX->x.pSelect : 0);
  if( ALWAYS(pParse->nErr==0) && isCandidateForInOpt(p) ){
    sqlite3 *db = pParse->db;              /* Database connection */
    Table *pTab;                           /* Table <table>. */
    Expr *pExpr;                           /* Expression <column> */
    i16 iCol;                              /* Index of column <column> */
    i16 iDb;                               /* Database idx for pTab */

    assert( p );                        /* Because of isCandidateForInOpt(p) */
    assert( p->pEList!=0 );             /* Because of isCandidateForInOpt(p) */
    assert( p->pEList->a[0].pExpr!=0 ); /* Because of isCandidateForInOpt(p) */
    assert( p->pSrc!=0 );               /* Because of isCandidateForInOpt(p) */
    pTab = p->pSrc->a[0].pTab;
    pExpr = p->pEList->a[0].pExpr;
    iCol = (i16)pExpr->iColumn;
   
    /* Code an OP_Transaction and OP_TableLock for <table>. */
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    sqlite3CodeVerifySchema(pParse, iDb);
    sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);

    /* This function is only called from two places. In both cases the vdbe
    ** has already been allocated. So assume sqlite3GetVdbe() is always
    ** successful here.
    */
    assert(v);
    if( iCol<0 ){
      int iAddr = sqlite3CodeOnce(pParse);
      VdbeCoverage(v);

      sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
      eType = IN_INDEX_ROWID;

      sqlite3VdbeJumpHere(v, iAddr);
    }else{
      Index *pIdx;                         /* Iterator variable */

      /* The collation sequence used by the comparison. If an index is to
      ** be used in place of a temp-table, it must be ordered according
      ** to this collation sequence.  */
      CollSeq *pReq = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pExpr);

      /* Check that the affinity that will be used to perform the 
      ** comparison is the same as the affinity of the column. If
      ** it is not, it is not possible to use any index.
      */
      int affinity_ok = sqlite3IndexAffinityOk(pX, pTab->aCol[iCol].affinity);

      for(pIdx=pTab->pIndex; pIdx && eType==0 && affinity_ok; pIdx=pIdx->pNext){
        if( (pIdx->aiColumn[0]==iCol)
         && sqlite3FindCollSeq(db, ENC(db), pIdx->azColl[0], 0)==pReq
         && (!mustBeUnique || (pIdx->nKeyCol==1 && IsUniqueIndex(pIdx)))
        ){
          int iAddr = sqlite3CodeOnce(pParse); VdbeCoverage(v);
          sqlite3VdbeAddOp3(v, OP_OpenRead, iTab, pIdx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
          VdbeComment((v, "%s", pIdx->zName));
          assert( IN_INDEX_INDEX_DESC == IN_INDEX_INDEX_ASC+1 );
          eType = IN_INDEX_INDEX_ASC + pIdx->aSortOrder[0];

          if( prRhsHasNull && !pTab->aCol[iCol].notNull ){
            *prRhsHasNull = ++pParse->nMem;
            sqlite3SetHasNullFlag(v, iTab, *prRhsHasNull);
          }
          sqlite3VdbeJumpHere(v, iAddr);
        }
      }
    }
  }

  /* If no preexisting index is available for the IN clause
  ** and IN_INDEX_NOOP is an allowed reply
  ** and the RHS of the IN operator is a list, not a subquery
  ** and the RHS is not contant or has two or fewer terms,
  ** then it is not worth creating an ephemeral table to evaluate
  ** the IN operator so return IN_INDEX_NOOP.
  */
  if( eType==0
   && (inFlags & IN_INDEX_NOOP_OK)
   && !ExprHasProperty(pX, EP_xIsSelect)
   && (!sqlite3InRhsIsConstant(pX) || pX->x.pList->nExpr<=2)
  ){
    eType = IN_INDEX_NOOP;
  }
     

  if( eType==0 ){
    /* Could not find an existing table or index to use as the RHS b-tree.
    ** We will have to generate an ephemeral table to do the job.
    */
    u32 savedNQueryLoop = pParse->nQueryLoop;
    int rMayHaveNull = 0;
    eType = IN_INDEX_EPH;
    if( inFlags & IN_INDEX_LOOP ){
      pParse->nQueryLoop = 0;
      if( pX->pLeft->iColumn<0 && !ExprHasProperty(pX, EP_xIsSelect) ){
        eType = IN_INDEX_ROWID;
      }
    }else if( prRhsHasNull ){
      *prRhsHasNull = rMayHaveNull = ++pParse->nMem;
    }
    sqlite3CodeSubselect(pParse, pX, rMayHaveNull, eType==IN_INDEX_ROWID);
    pParse->nQueryLoop = savedNQueryLoop;
  }else{
    pX->iTable = iTab;
  }
  return eType;
}